

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O1

ostream * std::operator<<(ostream *os,vector<unsigned_int,_std::allocator<unsigned_int>_> *buf)

{
  ostream *poVar1;
  pointer puVar2;
  byte bVar3;
  ostream oVar4;
  uint *b;
  pointer puVar5;
  ios state;
  ostream local_139;
  ios local_138 [264];
  
  poVar1 = os + *(long *)(*(long *)os + -0x18);
  if (os[*(long *)(*(long *)os + -0x18) + 0xe1] == (ostream)0x0) {
    oVar4 = (ostream)std::ios::widen((char)poVar1);
    poVar1[0xe0] = oVar4;
    poVar1[0xe1] = (ostream)0x1;
  }
  oVar4 = poVar1[0xe0];
  std::ios::ios(local_138,(streambuf *)0x0);
  std::ios::copyfmt((ios *)local_138);
  puVar5 = (buf->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (buf->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar5 != puVar2) {
    bVar3 = 0;
    do {
      std::ios::copyfmt((ios *)(os + *(long *)(*(long *)os + -0x18)));
      if (!(bool)(~bVar3 & 1 | oVar4 == (ostream)0x0)) {
        local_139 = oVar4;
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_139,1);
      }
      std::ostream::_M_insert<unsigned_long>((ulong)os);
      puVar5 = puVar5 + 1;
      bVar3 = 1;
    } while (puVar5 != puVar2);
  }
  std::ios_base::~ios_base((ios_base *)local_138);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream&os, const std::vector<T, A>& buf)
{
    auto fillchar = os.fill();
    std::ios state(NULL);  state.copyfmt(os);

    bool first= true;
    for (const auto& b : buf) {
        os.copyfmt(state);
        if (!first && fillchar) os << fillchar;
        if constexpr (std::is_integral_v<T> && sizeof(T)==1) {
            // This makes sure the numbers in byte and char vectors are printed 
            // as numbers, instead of as characters.
            os << +b;
        }
        else {
            os << b;
        }
        first= false;
    }
    return os;
}